

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_column_data.cpp
# Opt level: O0

void __thiscall
duckdb::ValidityColumnData::AppendData
          (ValidityColumnData *this,BaseStatistics *stats,ColumnAppendState *state,
          UnifiedVectorFormat *vdata,idx_t count)

{
  mutex_type *in_RDI;
  idx_t unaff_retaddr;
  UnifiedVectorFormat *in_stack_00000008;
  ColumnAppendState *in_stack_00000010;
  lock_guard<std::mutex> l;
  lock_guard<std::mutex> *in_stack_ffffffffffffffc0;
  
  ::std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffc0,in_RDI);
  ColumnData::AppendData
            ((ColumnData *)count,(BaseStatistics *)l._M_device,in_stack_00000010,in_stack_00000008,
             unaff_retaddr);
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xba1360);
  return;
}

Assistant:

void ValidityColumnData::AppendData(BaseStatistics &stats, ColumnAppendState &state, UnifiedVectorFormat &vdata,
                                    idx_t count) {
	lock_guard<mutex> l(stats_lock);
	ColumnData::AppendData(stats, state, vdata, count);
}